

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

void __thiscall
t_dart_generator::generate_dart_validator(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *field;
  t_type *ttype;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer pptVar4;
  t_dart_generator *ptVar5;
  string field_name;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar3,"validate()");
  std::__cxx11::string::string((string *)&local_170," ",(allocator *)&local_190);
  scope_up(this,out,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"// check for required fields");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if ((*pptVar4)->req_ == T_REQUIRED) {
      ptVar5 = (t_dart_generator *)&(*pptVar4)->name_;
      std::__cxx11::string::string((string *)&local_50,(string *)ptVar5);
      get_member_name(&local_190,ptVar5,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar1 = type_can_be_null(this,(*pptVar4)->type_);
      if (bVar1) {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"if (");
        poVar3 = std::operator<<(poVar3,(string *)&local_190);
        std::operator<<(poVar3," == null)");
        std::__cxx11::string::string((string *)&local_90," ",(allocator *)&local_110);
        scope_up(this,out,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,
                                 "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field \'"
                                );
        poVar3 = std::operator<<(poVar3,(string *)&local_190);
        poVar3 = std::operator<<(poVar3,"\' was not present! Struct: \" + toString());");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::string((string *)&local_b0,(string *)&::endl_abi_cxx11_);
        scope_down(this,out,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"// alas, we cannot check \'");
        poVar3 = std::operator<<(poVar3,(string *)&local_190);
        poVar3 = std::operator<<(poVar3,
                                 "\' because it\'s a primitive and you chose the non-beans generator."
                                );
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)&local_190);
    }
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"// check that fields of type enum have valid values");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  for (pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    field = *pptVar4;
    ttype = field->type_;
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar2 != '\0') {
      ptVar5 = (t_dart_generator *)&field->name_;
      std::__cxx11::string::string((string *)&local_70,(string *)ptVar5);
      get_member_name(&local_190,ptVar5,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"if (");
      generate_isset_check_abi_cxx11_(&local_110,this,field);
      poVar3 = std::operator<<(poVar3,(string *)&local_110);
      poVar3 = std::operator<<(poVar3," && !");
      get_ttype_class_name_abi_cxx11_(&local_d0,this,ttype);
      poVar3 = std::operator<<(poVar3,(string *)&local_d0);
      poVar3 = std::operator<<(poVar3,".VALID_VALUES.contains(");
      poVar3 = std::operator<<(poVar3,(string *)&local_190);
      std::operator<<(poVar3,"))");
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string((string *)&local_f0," ",(allocator *)&local_110);
      scope_up(this,out,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,
                               "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"The field \'"
                              );
      poVar3 = std::operator<<(poVar3,(string *)&local_190);
      poVar3 = std::operator<<(poVar3,"\' has been assigned the invalid value ");
      poVar3 = std::operator<<(poVar3,"$");
      poVar3 = std::operator<<(poVar3,(string *)&local_190);
      poVar3 = std::operator<<(poVar3,"\");");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_130,(string *)&::endl_abi_cxx11_);
      scope_down(this,out,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_190);
    }
  }
  std::__cxx11::string::string((string *)&local_150,(string *)&endl2_abi_cxx11_);
  scope_down(this,out,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  return;
}

Assistant:

void t_dart_generator::generate_dart_validator(ostream& out, t_struct* tstruct) {
  indent(out) << "validate()";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "// check for required fields" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      string field_name = get_member_name((*f_iter)->get_name());
      if (type_can_be_null((*f_iter)->get_type())) {
        indent(out) << "if (" << field_name << " == null)";
        scope_up(out);
        indent(out) << "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field '"
                    << field_name << "' was not present! Struct: \" + toString());"
                    << endl;
        scope_down(out);
      } else {
        indent(out) << "// alas, we cannot check '" << field_name
                    << "' because it's a primitive and you chose the non-beans generator." << endl;
      }
    }
  }

  // check that fields of type enum have valid values
  indent(out) << "// check that fields of type enum have valid values" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* field = (*f_iter);
    t_type* type = field->get_type();
    // if field is an enum, check that its value is valid
    if (type->is_enum()) {
      string field_name = get_member_name(field->get_name());
      indent(out) << "if (" << generate_isset_check(field) << " && !" << get_ttype_class_name(type)
                  << ".VALID_VALUES.contains(" << field_name << "))";
      scope_up(out);
      indent(out) << "throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"The field '"
                  << field_name << "' has been assigned the invalid value "
                  << "$" << field_name << "\");" << endl;
      scope_down(out);
    }
  }

  scope_down(out, endl2);
}